

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  long *plVar1;
  long lVar2;
  Printer *this_00;
  EnumDescriptor *pEVar3;
  LogMessage *pLVar4;
  long lVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar7;
  int number;
  Printer *local_120;
  long *local_118 [2];
  long local_108 [5];
  string original_name;
  string name;
  set<int,_std::less<int>,_std::allocator<int>_> used_number;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_names;
  
  WriteEnumDocComment(printer,this->descriptor_);
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)local_118,&this->super_SourceGeneratorBase);
  io::Printer::Print(printer,"$access_level$ enum $name$ {\n","access_level",(string *)local_118,
                     "name",*(string **)this->descriptor_);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  local_120 = printer;
  io::Printer::Indent(printer);
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_names._M_t._M_impl.super__Rb_tree_header._M_header;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_number._M_t._M_impl.super__Rb_tree_header._M_header;
  used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_number._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pEVar3 = this->descriptor_;
  used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(pEVar3 + 0x2c)) {
    lVar5 = 0;
    do {
      WriteEnumValueDocComment
                (local_120,(EnumValueDescriptor *)(lVar5 * 0x28 + *(long *)(pEVar3 + 0x30)));
      plVar1 = *(long **)(*(long *)(this->descriptor_ + 0x30) + lVar5 * 0x28);
      original_name._M_dataplus._M_p = (pointer)&original_name.field_2;
      lVar2 = *plVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&original_name,lVar2,plVar1[1] + lVar2);
      GetEnumValueName(&name,*(string **)this->descriptor_,
                       *(string **)(*(long *)(this->descriptor_ + 0x30) + lVar5 * 0x28));
      while( true ) {
        pVar6 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&used_names,&name);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_118,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_enum.cc"
                   ,0x4c);
        pLVar4 = internal::LogMessage::operator<<((LogMessage *)local_118,"Duplicate enum value ");
        pLVar4 = internal::LogMessage::operator<<(pLVar4,&name);
        pLVar4 = internal::LogMessage::operator<<(pLVar4," (originally ");
        pLVar4 = internal::LogMessage::operator<<(pLVar4,&original_name);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,") in ");
        pLVar4 = internal::LogMessage::operator<<(pLVar4,*(string **)this->descriptor_);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,"; adding underscore to distinguish");
        internal::LogFinisher::operator=((LogFinisher *)&number,pLVar4);
        internal::LogMessage::~LogMessage((LogMessage *)local_118);
        std::__cxx11::string::append((char *)&name);
      }
      number = *(int *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + lVar5 * 0x28);
      pVar7 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&used_number,&number);
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        SimpleItoa_abi_cxx11_((string *)local_118,(protobuf *)(ulong)(uint)number,pVar7._8_4_);
        io::Printer::Print(local_120,
                           "[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] $name$ = $number$,\n"
                           ,"original_name",&original_name,"name",&name,"number",(string *)local_118
                          );
      }
      else {
        SimpleItoa_abi_cxx11_((string *)local_118,(protobuf *)(ulong)(uint)number,pVar7._8_4_);
        io::Printer::Print(local_120,"[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n"
                           ,"original_name",&original_name,"name",&name,"number",(string *)local_118
                          );
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0],local_108[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)original_name._M_dataplus._M_p != &original_name.field_2) {
        operator_delete(original_name._M_dataplus._M_p,
                        original_name.field_2._M_allocated_capacity + 1);
      }
      lVar5 = lVar5 + 1;
      pEVar3 = this->descriptor_;
    } while (lVar5 < *(int *)(pEVar3 + 0x2c));
  }
  this_00 = local_120;
  io::Printer::Outdent(local_120);
  io::Printer::Print(this_00,"}\n");
  io::Printer::Print(this_00,"\n");
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&used_number._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&used_names._M_t);
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  printer->Print("$access_level$ enum $name$ {\n",
                 "access_level", class_access_level(),
                 "name", descriptor_->name());
  printer->Indent();
  std::set<string> used_names;
  std::set<int> used_number;
  for (int i = 0; i < descriptor_->value_count(); i++) {
      WriteEnumValueDocComment(printer, descriptor_->value(i));
      string original_name = descriptor_->value(i)->name();
      string name = GetEnumValueName(descriptor_->name(), descriptor_->value(i)->name());
      // Make sure we don't get any duplicate names due to prefix removal.
      while (!used_names.insert(name).second) {
        // It's possible we'll end up giving this warning multiple times, but that's better than not at all.
        GOOGLE_LOG(WARNING) << "Duplicate enum value " << name << " (originally " << original_name
          << ") in " << descriptor_->name() << "; adding underscore to distinguish";
        name += "_";
      }
      int number = descriptor_->value(i)->number();
      if (!used_number.insert(number).second) {
          printer->Print("[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] $name$ = $number$,\n",
             "original_name", original_name,
             "name", name,
             "number", SimpleItoa(number));
      } else {
          printer->Print("[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n",
             "original_name", original_name,
             "name", name,
             "number", SimpleItoa(number));
      }
  }
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}